

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error ft_property_do(FT_Library library,FT_String *module_name,FT_String *property_name,
                       void *value,FT_Bool set,FT_Bool value_is_string)

{
  long lVar1;
  int iVar2;
  FT_Module *ppFVar3;
  long *plVar4;
  FT_Error local_80;
  FT_Bool missing_func;
  FT_Service_Properties service;
  FT_Module_Interface interface;
  FT_Module *limit;
  FT_Module *cur;
  FT_Bool value_is_string_local;
  FT_Bool set_local;
  void *value_local;
  FT_String *property_name_local;
  FT_String *module_name_local;
  FT_Library library_local;
  
  if (library == (FT_Library)0x0) {
    library_local._4_4_ = 0x21;
  }
  else if (((module_name == (FT_String *)0x0) || (property_name == (FT_String *)0x0)) ||
          (value == (void *)0x0)) {
    library_local._4_4_ = 6;
  }
  else {
    limit = library->modules;
    ppFVar3 = limit + library->num_modules;
    while ((limit < ppFVar3 &&
           (iVar2 = strcmp((*limit)->clazz->module_name,module_name), iVar2 != 0))) {
      limit = limit + 1;
    }
    if (limit == ppFVar3) {
      library_local._4_4_ = 0xb;
    }
    else if ((*limit)->clazz->get_interface == (FT_Module_Requester)0x0) {
      library_local._4_4_ = 7;
    }
    else {
      plVar4 = (long *)(*(*limit)->clazz->get_interface)(*limit,"properties");
      if (plVar4 == (long *)0x0) {
        library_local._4_4_ = 7;
      }
      else {
        if (set == '\0') {
          lVar1 = plVar4[1];
        }
        else {
          lVar1 = *plVar4;
        }
        if (lVar1 == 0) {
          library_local._4_4_ = 7;
        }
        else {
          if (set == '\0') {
            local_80 = (*(code *)plVar4[1])(*limit,property_name,value);
          }
          else {
            local_80 = (*(code *)*plVar4)(*limit,property_name,value,value_is_string);
          }
          library_local._4_4_ = local_80;
        }
      }
    }
  }
  return library_local._4_4_;
}

Assistant:

static FT_Error
  ft_property_do( FT_Library        library,
                  const FT_String*  module_name,
                  const FT_String*  property_name,
                  void*             value,
                  FT_Bool           set,
                  FT_Bool           value_is_string )
  {
    FT_Module*           cur;
    FT_Module*           limit;
    FT_Module_Interface  interface;

    FT_Service_Properties  service;

#ifdef FT_DEBUG_LEVEL_ERROR
    const FT_String*  set_name  = "FT_Property_Set";
    const FT_String*  get_name  = "FT_Property_Get";
    const FT_String*  func_name = set ? set_name : get_name;
#endif

    FT_Bool  missing_func;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !module_name || !property_name || !value )
      return FT_THROW( Invalid_Argument );

    cur   = library->modules;
    limit = cur + library->num_modules;

    /* search module */
    for ( ; cur < limit; cur++ )
      if ( !ft_strcmp( cur[0]->clazz->module_name, module_name ) )
        break;

    if ( cur == limit )
    {
      FT_ERROR(( "%s: can't find module `%s'\n",
                 func_name, module_name ));
      return FT_THROW( Missing_Module );
    }

    /* check whether we have a service interface */
    if ( !cur[0]->clazz->get_interface )
    {
      FT_ERROR(( "%s: module `%s' doesn't support properties\n",
                 func_name, module_name ));
      return FT_THROW( Unimplemented_Feature );
    }

    /* search property service */
    interface = cur[0]->clazz->get_interface( cur[0],
                                              FT_SERVICE_ID_PROPERTIES );
    if ( !interface )
    {
      FT_ERROR(( "%s: module `%s' doesn't support properties\n",
                 func_name, module_name ));
      return FT_THROW( Unimplemented_Feature );
    }

    service = (FT_Service_Properties)interface;

    if ( set )
      missing_func = (FT_Bool)( !service->set_property );
    else
      missing_func = (FT_Bool)( !service->get_property );

    if ( missing_func )
    {
      FT_ERROR(( "%s: property service of module `%s' is broken\n",
                 func_name, module_name ));
      return FT_THROW( Unimplemented_Feature );
    }

    return set ? service->set_property( cur[0],
                                        property_name,
                                        value,
                                        value_is_string )
               : service->get_property( cur[0],
                                        property_name,
                                        value );
  }